

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall pugi::xml_node::remove_attribute(xml_node *this,xml_attribute *a)

{
  xml_node_struct *node;
  xml_attribute_struct *attr;
  xml_allocator *alloc;
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  bool bVar3;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct **ppxVar5;
  
  node = this->_root;
  if (((node != (xml_node_struct *)0x0) && (attr = a->_attr, attr != (xml_attribute_struct *)0x0))
     && (bVar3 = impl::anon_unknown_0::is_attribute_of(attr,node), bVar3)) {
    alloc = *(xml_allocator **)((long)node - (node->header >> 8));
    pxVar1 = attr->prev_attribute_c;
    pxVar2 = attr->next_attribute;
    pxVar4 = pxVar2;
    if (pxVar2 == (xml_attribute_struct *)0x0) {
      pxVar4 = node->first_attribute;
    }
    pxVar4->prev_attribute_c = pxVar1;
    ppxVar5 = &node->first_attribute;
    if (pxVar1->next_attribute != (xml_attribute_struct *)0x0) {
      ppxVar5 = &pxVar1->next_attribute;
    }
    *ppxVar5 = pxVar2;
    attr->prev_attribute_c = (xml_attribute_struct *)0x0;
    attr->next_attribute = (xml_attribute_struct *)0x0;
    impl::anon_unknown_0::destroy_attribute(a->_attr,alloc);
    return true;
  }
  return false;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_attribute(const xml_attribute& a)
	{
		if (!_root || !a._attr) return false;
		if (!impl::is_attribute_of(a._attr, _root)) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		impl::remove_attribute(a._attr, _root);
		impl::destroy_attribute(a._attr, alloc);

		return true;
	}